

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# date_time.cpp
# Opt level: O0

void __thiscall booster::locale::calendar::calendar(calendar *this,ios_base *ios)

{
  locale *__loc;
  calendar_facet *pcVar1;
  abstract_calendar *paVar2;
  long in_RDI;
  ios_info *in_stack_ffffffffffffff98;
  
  std::ios_base::getloc((ios_base *)in_stack_ffffffffffffff98);
  ios_info::get((ios_base *)0x22f942);
  ios_info::time_zone_abi_cxx11_(in_stack_ffffffffffffff98);
  __loc = (locale *)(in_RDI + 0x28);
  pcVar1 = std::use_facet<booster::locale::calendar_facet>(__loc);
  paVar2 = (abstract_calendar *)(**(code **)(*(long *)pcVar1 + 0x10))();
  hold_ptr<booster::locale::abstract_calendar>::hold_ptr
            ((hold_ptr<booster::locale::abstract_calendar> *)__loc,paVar2);
  paVar2 = hold_ptr<booster::locale::abstract_calendar>::operator->
                     ((hold_ptr<booster::locale::abstract_calendar> *)(in_RDI + 0x28));
  (*paVar2->_vptr_abstract_calendar[10])(paVar2,in_RDI + 8);
  return;
}

Assistant:

calendar::calendar(std::ios_base &ios) :
    locale_(ios.getloc()),
    tz_(ios_info::get(ios).time_zone()),
    impl_(std::use_facet<calendar_facet>(locale_).create_calendar())
{
    impl_->set_timezone(tz_);
    
}